

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O0

void __thiscall deqp::gles2::Functional::SimpleProgramCase::compileShaders(SimpleProgramCase *this)

{
  GLuint shader;
  GLuint shader_00;
  deBool dVar1;
  GLenum err;
  TestError *pTVar2;
  GLuint fragShader;
  GLuint vertShader;
  char *fragSource;
  char *vertSource;
  SimpleProgramCase *this_local;
  
  vertSource = (char *)this;
  fragSource = anon_unknown_0::getSimpleShaderSource(SHADERTYPE_VERTEX);
  _fragShader = anon_unknown_0::getSimpleShaderSource(SHADERTYPE_FRAGMENT);
  shader = glu::CallLogWrapper::glCreateShader(&(this->super_ApiCase).super_CallLogWrapper,0x8b31);
  shader_00 = glu::CallLogWrapper::glCreateShader
                        (&(this->super_ApiCase).super_CallLogWrapper,0x8b30);
  while ((dVar1 = ::deGetFalse(), dVar1 == 0 && (shader != 0))) {
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      while ((dVar1 = ::deGetFalse(), dVar1 == 0 && (shader_00 != 0))) {
        dVar1 = ::deGetFalse();
        if (dVar1 == 0) {
          glu::CallLogWrapper::glShaderSource
                    (&(this->super_ApiCase).super_CallLogWrapper,shader,1,&fragSource,(GLint *)0x0);
          glu::CallLogWrapper::glCompileShader(&(this->super_ApiCase).super_CallLogWrapper,shader);
          glu::CallLogWrapper::glShaderSource
                    (&(this->super_ApiCase).super_CallLogWrapper,shader_00,1,(GLchar **)&fragShader,
                     (GLint *)0x0);
          glu::CallLogWrapper::glCompileShader
                    (&(this->super_ApiCase).super_CallLogWrapper,shader_00);
          err = glu::CallLogWrapper::glGetError(&(this->super_ApiCase).super_CallLogWrapper);
          glu::checkError(err,(char *)0x0,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderApiTests.cpp"
                          ,0x1a4);
          this->m_vertShader = shader;
          this->m_fragShader = shader_00;
          return;
        }
      }
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,(char *)0x0,"fragShader != 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderApiTests.cpp"
                 ,0x19c);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar2,(char *)0x0,"vertShader != 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderApiTests.cpp"
             ,0x19b);
  __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

virtual void compileShaders (void)
	{
		const char*		vertSource	= getSimpleShaderSource(glu::SHADERTYPE_VERTEX);
		const char*		fragSource	= getSimpleShaderSource(glu::SHADERTYPE_FRAGMENT);

		const GLuint	vertShader	= glCreateShader(GL_VERTEX_SHADER);
		const GLuint	fragShader	= glCreateShader(GL_FRAGMENT_SHADER);

		TCU_CHECK(vertShader != 0);
		TCU_CHECK(fragShader != 0);

		glShaderSource(vertShader, 1, &vertSource, 0);
		glCompileShader(vertShader);

		glShaderSource(fragShader, 1, &fragSource, 0);
		glCompileShader(fragShader);

		GLU_CHECK();

		m_vertShader = vertShader;
		m_fragShader = fragShader;
	}